

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::CordFieldGenerator::
GenerateMemberConstexprConstructor(CordFieldGenerator *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  Printer *pPVar1;
  bool bVar2;
  Sub *local_1b0;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  undefined1 local_161;
  char *local_160 [3];
  allocator<char> local_141;
  string local_140;
  Sub *local_120;
  Sub local_118;
  iterator local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_50;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  string_view local_28;
  Printer *local_18;
  Printer *p_local;
  CordFieldGenerator *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  local_28 = FieldDescriptor::default_value_string((this->super_FieldGeneratorBase).field_);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_28);
  pPVar1 = local_18;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"$name$_{}");
    protobuf::io::Printer::SourceLocation::current();
    protobuf::io::Printer::Emit(pPVar1,local_38._M_len,local_38._M_str);
  }
  else {
    local_161 = 1;
    local_120 = &local_118;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"Split",&local_141);
    bVar2 = ShouldSplit((this->super_FieldGeneratorBase).field_,
                        (this->super_FieldGeneratorBase).options_);
    local_160[0] = anon_var_dwarf_37cdd0 + 5;
    if (bVar2) {
      local_160[0] = "Split::";
    }
    protobuf::io::Printer::Sub::Sub<char_const*>(&local_118,&local_140,local_160);
    local_161 = 0;
    local_60 = &local_118;
    local_58 = 1;
    v._M_len = 1;
    v._M_array = local_60;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_50._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_178,
               "$name$_{::absl::strings_internal::MakeStringConstant($classname$::Impl_::$Split$_default_$name$_func_{})}"
              );
    protobuf::io::Printer::SourceLocation::current();
    protobuf::io::Printer::Emit
              (pPVar1,local_50._M_allocated_capacity,local_50._8_8_,local_178._M_len,
               local_178._M_str);
    local_1b0 = (Sub *)&local_60;
    do {
      local_1b0 = local_1b0 + -1;
      protobuf::io::Printer::Sub::~Sub(local_1b0);
    } while (local_1b0 != &local_118);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
  }
  return;
}

Assistant:

void GenerateMemberConstexprConstructor(io::Printer* p) const override {
    if (field_->default_value_string().empty()) {
      p->Emit("$name$_{}");
    } else {
      p->Emit({{"Split", ShouldSplit(field_, options_) ? "Split::" : ""}},
              "$name$_{::absl::strings_internal::MakeStringConstant("
              "$classname$::Impl_::$Split$_default_$name$_func_{})}");
    }
  }